

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawPartialDecal
          (PixelGameEngine *this,vf2d *pos,vf2d *size,Decal *decal,vf2d *source_pos,
          vf2d *source_size,Pixel *tint)

{
  reference pvVar1;
  float fVar2;
  float fVar3;
  vf2d local_108;
  vf2d local_100;
  vf2d local_f8;
  vf2d local_f0;
  v2d_generic<float> local_e8;
  v2d_generic<float> local_e0;
  vf2d uvbr;
  vf2d uvtl;
  vf2d local_c8;
  vf2d local_c0;
  v2d_generic<float> local_b8;
  undefined1 local_b0 [8];
  DecalInstance di;
  vf2d vScreenSpaceDim;
  vf2d vScreenSpacePos;
  vf2d *source_size_local;
  vf2d *source_pos_local;
  Decal *decal_local;
  vf2d *size_local;
  vf2d *pos_local;
  PixelGameEngine *this_local;
  
  fVar2 = pos->x * (this->vInvScreenSize).x;
  fVar3 = pos->y * (this->vInvScreenSize).y;
  v2d_generic<float>::v2d_generic
            (&vScreenSpaceDim,fVar2 + fVar2 + -1.0,(fVar3 + fVar3 + -1.0) * -1.0);
  v2d_generic<float>::v2d_generic
            ((v2d_generic<float> *)(di.tint + 2),
             size->x * 2.0 * (this->vInvScreenSize).x + vScreenSpaceDim.x,
             -(size->y * 2.0) * (this->vInvScreenSize).y + vScreenSpaceDim.y);
  DecalInstance::DecalInstance((DecalInstance *)local_b0);
  di.w[2] = *(float *)&tint->field_0;
  local_b0 = (undefined1  [8])decal;
  v2d_generic<float>::v2d_generic(&local_b8,vScreenSpaceDim.x,vScreenSpaceDim.y);
  di.decal = (Decal *)local_b8;
  v2d_generic<float>::v2d_generic(&local_c0,vScreenSpaceDim.x,(float)di.tint[3].field_0);
  di.pos[0] = local_c0;
  v2d_generic<float>::v2d_generic(&local_c8,(float)di.tint[2].field_0,(float)di.tint[3].field_0);
  di.pos[1] = local_c8;
  v2d_generic<float>::v2d_generic(&uvtl,(float)di.tint[2].field_0,vScreenSpaceDim.y);
  di.pos[2] = uvtl;
  v2d_generic<float>::operator*(&uvbr,source_pos);
  v2d_generic<float>::operator*(&local_e8,source_size);
  v2d_generic<float>::operator+(&local_e0,&uvbr);
  v2d_generic<float>::v2d_generic(&local_f0,uvbr.x,uvbr.y);
  di.pos[3] = local_f0;
  v2d_generic<float>::v2d_generic(&local_f8,uvbr.x,local_e0.y);
  di.uv[0] = local_f8;
  v2d_generic<float>::v2d_generic(&local_100,local_e0.x,local_e0.y);
  di.uv[1] = local_100;
  v2d_generic<float>::v2d_generic(&local_108,local_e0.x,uvbr.y);
  di.uv[2] = local_108;
  pvVar1 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                     (&this->vLayers,(ulong)this->nTargetLayer);
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&pvVar1->vecDecalInstance,(value_type *)local_b0);
  return;
}

Assistant:

void PixelGameEngine::DrawPartialDecal(const olc::vf2d& pos, const olc::vf2d& size, olc::Decal* decal, const olc::vf2d& source_pos, const olc::vf2d& source_size, const olc::Pixel& tint)
	{
		olc::vf2d vScreenSpacePos =
		{
			(pos.x * vInvScreenSize.x) * 2.0f - 1.0f,
			((pos.y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f
		};

		olc::vf2d vScreenSpaceDim =
		{
			vScreenSpacePos.x + (2.0f * size.x * vInvScreenSize.x),
			vScreenSpacePos.y - (2.0f * size.y * vInvScreenSize.y)
		};

		DecalInstance di; di.decal = decal;	di.tint[0] = tint;

		di.pos[0] = { vScreenSpacePos.x, vScreenSpacePos.y };
		di.pos[1] = { vScreenSpacePos.x, vScreenSpaceDim.y };
		di.pos[2] = { vScreenSpaceDim.x, vScreenSpaceDim.y };
		di.pos[3] = { vScreenSpaceDim.x, vScreenSpacePos.y };

		olc::vf2d uvtl = source_pos * decal->vUVScale;
		olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
		di.uv[0] = { uvtl.x, uvtl.y }; di.uv[1] = { uvtl.x, uvbr.y };
		di.uv[2] = { uvbr.x, uvbr.y }; di.uv[3] = { uvbr.x, uvtl.y };
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}